

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_to_n32_unsafe.cc
# Opt level: O0

bool s_to_i32_unsafe(char *s,char *s_end,int32_t *number)

{
  int iVar1;
  long local_30;
  int64_t i;
  int32_t *number_local;
  char *s_end_local;
  char *s_local;
  
  local_30 = 0;
  s_end_local = s;
  if (*s == '-') {
    for (s_end_local = s + 1; s_end_local != s_end; s_end_local = s_end_local + 1) {
      local_30 = local_30 * 10 - (long)(*s_end_local + -0x30);
      iVar1 = std::numeric_limits<int>::min();
      if (local_30 < iVar1) {
        return false;
      }
    }
  }
  else {
    for (; s_end_local != s_end; s_end_local = s_end_local + 1) {
      local_30 = (long)(*s_end_local + -0x30) + local_30 * 10;
      iVar1 = std::numeric_limits<int>::max();
      if (iVar1 < local_30) {
        return false;
      }
    }
  }
  *number = (int32_t)local_30;
  return true;
}

Assistant:

bool s_to_i32_unsafe (const char * s, const char * s_end, int32_t & number)
{
	int64_t i = 0;
	if (*s == '-')
	{
		++s;
		for (; s != s_end; ++s)
		{
			i *= 10;
			i -= *s - 0x30;
			if (i < std::numeric_limits<int32_t>::min())
			{
				return false;
			}
		}
	}
	else
	{
		for (; s != s_end; ++s)
		{
			i *= 10;
			i += *s - 0x30;
			if (i > std::numeric_limits<int32_t>::max())
			{
				return false;
			}
		}
	}
	number = static_cast<int32_t> (i);
	return true;
}